

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O3

string * __thiscall
anon_unknown.dwarf_1efe887::EvaluateSplitConfigGenex
          (string *__return_storage_ptr__,anon_unknown_dwarf_1efe887 *this,string_view input,
          cmGeneratorExpression *ge,cmLocalGenerator *lg,bool useOutputConfig,string *outputConfig,
          string *commandConfig,cmGeneratorTarget *target,
          set<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>,_std::less<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>,_std::allocator<BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>_>_>
          *utils)

{
  BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
  *__args;
  pointer pcVar1;
  _func_int ***ppp_Var2;
  int iVar3;
  anon_unknown_dwarf_1efe887 *paVar4;
  string *psVar5;
  _Rb_tree_node_base *p_Var6;
  string *extraout_RAX;
  byte bVar7;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var10;
  long lVar11;
  _Rb_tree_header *p_Var12;
  bool bVar13;
  basic_string_view<char,_std::char_traits<char>_> __str;
  basic_string_view<char,_std::char_traits<char>_> __str_00;
  basic_string_view<char,_std::char_traits<char>_> __str_01;
  basic_string_view<char,_std::char_traits<char>_> __str_02;
  undefined7 in_stack_00000009;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  uint local_e4;
  basic_string_view<char,_std::char_traits<char>_> local_d8;
  undefined1 local_c8 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b0;
  byte local_a0;
  undefined8 local_98;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  byte local_68;
  long *local_60 [2];
  long local_50 [2];
  cmLocalGenerator *local_40;
  string *local_38;
  
  local_38 = (string *)input._M_str;
  local_d8._M_str = (char *)input._M_len;
  local_e4 = (uint)lg;
  psVar5 = (string *)&__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)psVar5;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (this != (anon_unknown_dwarf_1efe887 *)0x0) {
    __args = (BT<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool>_>
              *)(local_c8 + 8);
    local_d8._M_len = (size_t)this;
    local_40 = (cmLocalGenerator *)ge;
    do {
      paVar4 = (anon_unknown_dwarf_1efe887 *)
               std::basic_string_view<char,_std::char_traits<char>_>::find(&local_d8,"$<",0,2);
      psVar5 = (string *)
               std::__cxx11::string::append((char *)__return_storage_ptr__,(ulong)local_d8._M_str);
      if (paVar4 == (anon_unknown_dwarf_1efe887 *)0xffffffffffffffff) {
        return psVar5;
      }
      paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(local_d8._M_len + -(long)paVar4);
      if (local_d8._M_len < paVar4) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   paVar4);
      }
      local_d8._M_str = local_d8._M_str + (long)paVar4;
      local_d8._M_len = (size_t)paVar8;
      if (paVar8 < (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x3) {
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x2;
        bVar13 = false;
      }
      else {
        lVar11 = 1;
        paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)0x2;
        do {
          paVar9 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(local_d8._M_len + -(long)paVar8);
          ppp_Var2 = (_func_int ***)local_d8._M_str;
          __str._M_str = "$<";
          __str._M_len = 2;
          local_c8._8_8_ = paVar9;
          local_b8._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               (paVar8->_M_local_buf + (long)ppp_Var2);
          iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)__args,0,2,__str);
          if (iVar3 == 0) {
            lVar11 = lVar11 + 1;
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar8->_M_local_buf + 1);
          }
          else {
            __str_00._M_str = ">";
            __str_00._M_len = 1;
            local_c8._8_8_ = paVar9;
            local_b8._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 (paVar8->_M_local_buf + (long)ppp_Var2);
            iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                              ((basic_string_view<char,_std::char_traits<char>_> *)__args,0,1,
                               __str_00);
            if ((iVar3 == 0) && (lVar11 = lVar11 + -1, lVar11 == 0)) {
              paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar8->_M_local_buf + 1);
              bVar13 = true;
              goto LAB_004e29f6;
            }
          }
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar8->_M_local_buf + 1);
        } while (paVar8 < local_d8._M_len);
        bVar13 = lVar11 == 0;
      }
LAB_004e29f6:
      p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_d8._M_str;
      paVar4 = (anon_unknown_dwarf_1efe887 *)(local_d8._M_len + -(long)paVar8);
      if (local_d8._M_len < paVar8) {
        std::__throw_out_of_range_fmt
                  ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                   paVar8,local_d8._M_len);
      }
      local_d8._M_str = paVar8->_M_local_buf + (long)local_d8._M_str;
      psVar5 = outputConfig;
      if ((local_e4 & 1) != 0) {
        psVar5 = (string *)CONCAT71(in_stack_00000009,useOutputConfig);
      }
      local_d8._M_len = (size_t)paVar4;
      if (bVar13) {
        if ((anonymous_namespace)::
            EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
            ::COMMAND_CONFIG == '\0') {
          _GLOBAL__N_1::EvaluateSplitConfigGenex();
        }
        if ((anonymous_namespace)::
            EvaluateSplitConfigGenex(std::basic_string_view<char,std::char_traits<char>>,cmGeneratorExpression_const&,cmLocalGenerator*,bool,std::__cxx11::string_const&,std::__cxx11::string_const&,cmGeneratorTarget_const*,std::set<BT<std::pair<std::__cxx11::string,bool>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>*)
            ::OUTPUT_CONFIG == '\0') {
          _GLOBAL__N_1::EvaluateSplitConfigGenex();
        }
        local_b8._M_pi = p_Var10;
        __str_01._M_str = EvaluateSplitConfigGenex::COMMAND_CONFIG._M_str;
        __str_01._M_len = EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len;
        local_c8._8_8_ = paVar8;
        iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)__args,0,
                           EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len,__str_01);
        if (iVar3 == 0) {
          p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    ((long)&p_Var10->_vptr__Sp_counted_base +
                    EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len);
          paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar8->_M_local_buf + ~EvaluateSplitConfigGenex::COMMAND_CONFIG._M_len);
          local_e4 = 0;
          psVar5 = outputConfig;
        }
        else {
          local_b8._M_pi = p_Var10;
          __str_02._M_str = EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_str;
          __str_02._M_len = EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len;
          local_c8._8_8_ = paVar8;
          iVar3 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                            ((basic_string_view<char,_std::char_traits<char>_> *)__args,0,
                             EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len,__str_02);
          if (iVar3 == 0) {
            p_Var10 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ((long)&p_Var10->_vptr__Sp_counted_base +
                      EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len);
            paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(paVar8->_M_local_buf + ~EvaluateSplitConfigGenex::OUTPUT_CONFIG._M_len);
            local_e4 = 1;
            psVar5 = (string *)CONCAT71(in_stack_00000009,useOutputConfig);
          }
        }
      }
      local_60[0] = local_50;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_60,p_Var10,paVar8->_M_local_buf + (long)p_Var10);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_c8,local_38);
      if (local_60[0] != local_50) {
        operator_delete(local_60[0],local_50[0] + 1);
      }
      local_c8._8_8_ = &local_b0;
      local_b8._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_b0._M_allocated_capacity = local_b0._M_allocated_capacity & 0xffffffffffffff00;
      psVar5 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_c8._0_8_,local_40,psVar5,
                          (cmGeneratorTarget *)commandConfig,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,(string *)__args);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)(psVar5->_M_dataplus)._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c8._8_8_ != &local_b0) {
        operator_delete((void *)local_c8._8_8_,local_b0._M_allocated_capacity + 1);
      }
      if (target != (cmGeneratorTarget *)0x0) {
        p_Var6 = (((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                    *)(local_c8._0_8_ + 0x50))->_M_t)._M_impl.super__Rb_tree_header._M_header.
                 _M_left;
        p_Var12 = &(((set<cmGeneratorTarget_*,_std::less<cmGeneratorTarget_*>,_std::allocator<cmGeneratorTarget_*>_>
                      *)(local_c8._0_8_ + 0x50))->_M_t)._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)p_Var6 != p_Var12) {
          bVar7 = ~(byte)local_e4 & 1;
          do {
            psVar5 = cmGeneratorTarget::GetName_abi_cxx11_(*(cmGeneratorTarget **)(p_Var6 + 1));
            pcVar1 = (psVar5->_M_dataplus)._M_p;
            local_88 = &local_78;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_88,pcVar1,pcVar1 + psVar5->_M_string_length);
            local_98 = *(undefined8 *)local_c8._0_8_;
            local_90 = ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_c8._0_8_ + 8))->_M_pi;
            local_c8._8_8_ = &local_b0;
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                local_90->_M_use_count = local_90->_M_use_count + 1;
                UNLOCK();
              }
              else {
                local_90->_M_use_count = local_90->_M_use_count + 1;
              }
            }
            if (local_88 == &local_78) {
              local_b0._8_8_ = local_78._8_8_;
            }
            else {
              local_c8._8_8_ = local_88;
            }
            local_b0._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
            local_b0._M_local_buf[0] = local_78._M_local_buf[0];
            local_b8._M_pi = local_80;
            local_80 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            local_78._M_local_buf[0] = '\0';
            local_a0 = bVar7;
            local_88 = &local_78;
            local_68 = bVar7;
            std::
            _Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
            ::_M_emplace_unique<BT<std::pair<std::__cxx11::string,bool>>>
                      ((_Rb_tree<BT<std::pair<std::__cxx11::string,bool>>,BT<std::pair<std::__cxx11::string,bool>>,std::_Identity<BT<std::pair<std::__cxx11::string,bool>>>,std::less<BT<std::pair<std::__cxx11::string,bool>>>,std::allocator<BT<std::pair<std::__cxx11::string,bool>>>>
                        *)target,__args);
            if (local_90 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_90);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_c8._8_8_ != &local_b0) {
              operator_delete((void *)local_c8._8_8_,local_b0._M_allocated_capacity + 1);
            }
            if (local_88 != &local_78) {
              operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,
                                                local_78._M_local_buf[0]) + 1);
            }
            p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6);
          } while ((_Rb_tree_header *)p_Var6 != p_Var12);
        }
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_c8);
      psVar5 = extraout_RAX;
    } while ((anon_unknown_dwarf_1efe887 *)local_d8._M_len != (anon_unknown_dwarf_1efe887 *)0x0);
  }
  return psVar5;
}

Assistant:

std::string EvaluateSplitConfigGenex(
  cm::string_view input, cmGeneratorExpression const& ge, cmLocalGenerator* lg,
  bool useOutputConfig, std::string const& outputConfig,
  std::string const& commandConfig, cmGeneratorTarget const* target,
  std::set<BT<std::pair<std::string, bool>>>* utils = nullptr)
{
  std::string result;

  while (!input.empty()) {
    // Copy non-genex content directly to the result.
    std::string::size_type pos = input.find("$<");
    result += input.substr(0, pos);
    if (pos == std::string::npos) {
      break;
    }
    input = input.substr(pos);

    // Find the balanced end of this regex.
    size_t nestingLevel = 1;
    for (pos = 2; pos < input.size(); ++pos) {
      cm::string_view cur = input.substr(pos);
      if (cmHasLiteralPrefix(cur, "$<")) {
        ++nestingLevel;
        ++pos;
        continue;
      }
      if (cmHasLiteralPrefix(cur, ">")) {
        --nestingLevel;
        if (nestingLevel == 0) {
          ++pos;
          break;
        }
      }
    }

    // Split this genex from following input.
    cm::string_view genex = input.substr(0, pos);
    input = input.substr(pos);

    // Convert an outer COMMAND_CONFIG or OUTPUT_CONFIG to the matching config.
    std::string const* config =
      useOutputConfig ? &outputConfig : &commandConfig;
    if (nestingLevel == 0) {
      static cm::string_view const COMMAND_CONFIG = "$<COMMAND_CONFIG:"_s;
      static cm::string_view const OUTPUT_CONFIG = "$<OUTPUT_CONFIG:"_s;
      if (cmHasPrefix(genex, COMMAND_CONFIG)) {
        genex.remove_prefix(COMMAND_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = false;
        config = &commandConfig;
      } else if (cmHasPrefix(genex, OUTPUT_CONFIG)) {
        genex.remove_prefix(OUTPUT_CONFIG.size());
        genex.remove_suffix(1);
        useOutputConfig = true;
        config = &outputConfig;
      }
    }

    // Evaluate this genex in the selected configuration.
    std::unique_ptr<cmCompiledGeneratorExpression> cge =
      ge.Parse(std::string(genex));
    result += cge->Evaluate(lg, *config, target);

    // Record targets referenced by the genex.
    if (utils) {
      // Use a cross-dependency if we referenced the command config.
      bool const cross = !useOutputConfig;
      for (cmGeneratorTarget* gt : cge->GetTargets()) {
        utils->emplace(BT<std::pair<std::string, bool>>(
          { gt->GetName(), cross }, cge->GetBacktrace()));
      }
    }
  }

  return result;
}